

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O1

void __thiscall libtorrent::http_parser::~http_parser(http_parser *this)

{
  pointer ppVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  ppVar1 = (this->m_chunked_ranges).
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1,(long)(this->m_chunked_ranges).
                                 super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->m_header)._M_t);
  pcVar2 = (this->m_server_message)._M_dataplus._M_p;
  paVar3 = &(this->m_server_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_protocol)._M_dataplus._M_p;
  paVar3 = &(this->m_protocol).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_path)._M_dataplus._M_p;
  paVar3 = &(this->m_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_method)._M_dataplus._M_p;
  paVar3 = &(this->m_method).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

http_parser::~http_parser() = default;